

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeCalcTabBarLayout
               (ImGuiDockNode *node,ImRect *out_title_rect,ImRect *out_tab_bar_rect,
               ImVec2 *out_window_menu_button_pos)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 window_menu_button_pos;
  ImRect r;
  ImGuiContext *g;
  ImVec2 *out_window_menu_button_pos_local;
  ImRect *out_tab_bar_rect_local;
  ImRect *out_title_rect_local;
  ImGuiDockNode *node_local;
  
  pIVar6 = GImGui;
  fVar1 = (GImGui->Style).FramePadding.y;
  ImRect::ImRect((ImRect *)&window_menu_button_pos,(node->Pos).x,(node->Pos).y,
                 (node->Pos).x + (node->Size).x,fVar1 + fVar1 + (node->Pos).y + GImGui->FontSize);
  if (out_title_rect != (ImRect *)0x0) {
    IVar2.y = window_menu_button_pos.y;
    IVar2.x = window_menu_button_pos.x;
    out_title_rect->Min = IVar2;
    IVar4.y = r.Min.y;
    IVar4.x = r.Min.x;
    out_title_rect->Max = IVar4;
  }
  local_48.y = window_menu_button_pos.y;
  local_48.x = window_menu_button_pos.x;
  window_menu_button_pos.x = (pIVar6->Style).FramePadding.x + window_menu_button_pos.x;
  r.Min.x = r.Min.x - (pIVar6->Style).FramePadding.x;
  if ((*(ushort *)&node->field_0xb8 >> 0xb & 1) != 0) {
    r.Min.x = r.Min.x - pIVar6->FontSize;
  }
  if (((*(ushort *)&node->field_0xb8 >> 0xc & 1) == 0) ||
     ((pIVar6->Style).WindowMenuButtonPosition != 0)) {
    if (((*(ushort *)&node->field_0xb8 >> 0xc & 1) != 0) &&
       ((pIVar6->Style).WindowMenuButtonPosition == 1)) {
      r.Min.x = r.Min.x - (pIVar6->FontSize + (pIVar6->Style).FramePadding.x);
      ImVec2::ImVec2(&local_50,r.Min.x,window_menu_button_pos.y);
      local_48 = local_50;
    }
  }
  else {
    window_menu_button_pos.x = pIVar6->FontSize + window_menu_button_pos.x;
  }
  if (out_tab_bar_rect != (ImRect *)0x0) {
    IVar3.y = window_menu_button_pos.y;
    IVar3.x = window_menu_button_pos.x;
    out_tab_bar_rect->Min = IVar3;
    IVar5.y = r.Min.y;
    IVar5.x = r.Min.x;
    out_tab_bar_rect->Max = IVar5;
  }
  if (out_window_menu_button_pos != (ImVec2 *)0x0) {
    *out_window_menu_button_pos = local_48;
  }
  return;
}

Assistant:

static void ImGui::DockNodeCalcTabBarLayout(const ImGuiDockNode* node, ImRect* out_title_rect, ImRect* out_tab_bar_rect, ImVec2* out_window_menu_button_pos)
{
    ImGuiContext& g = *GImGui;
    ImRect r = ImRect(node->Pos.x, node->Pos.y, node->Pos.x + node->Size.x, node->Pos.y + g.FontSize + g.Style.FramePadding.y * 2.0f);
    if (out_title_rect) { *out_title_rect = r; }

    ImVec2 window_menu_button_pos = r.Min;
    r.Min.x += g.Style.FramePadding.x;
    r.Max.x -= g.Style.FramePadding.x;
    if (node->HasCloseButton)
    {
        r.Max.x -= g.FontSize;// +1.0f; // In DockNodeUpdateTabBar() we currently display a disabled close button even if there is none.
    }
    if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        r.Min.x += g.FontSize; // + g.Style.ItemInnerSpacing.x; // <-- Adding ItemInnerSpacing makes the title text moves slightly when in a docking tab bar. Instead we adjusted RenderArrowDockMenu()
    }
    else if (node->HasWindowMenuButton && g.Style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        r.Max.x -= g.FontSize + g.Style.FramePadding.x;
        window_menu_button_pos = ImVec2(r.Max.x, r.Min.y);
    }
    if (out_tab_bar_rect) { *out_tab_bar_rect = r; }
    if (out_window_menu_button_pos) { *out_window_menu_button_pos = window_menu_button_pos; }
}